

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O3

void kv_get_var_test(btree_kv_ops *kv_ops)

{
  int iVar1;
  bnode *__ptr;
  char *__format;
  uint64_t v_out;
  uint64_t v_in;
  timeval __test_begin;
  char local_68 [16];
  long local_58;
  long local_50;
  char local_48 [16];
  char local_38 [8];
  timeval local_30;
  
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = (bnode *)malloc(0x1010);
  __ptr->kvsize = 0x808;
  __ptr->flag = 0;
  __ptr->level = 1;
  __ptr->nentry = 0;
  (__ptr->field_4).data = __ptr + 1;
  builtin_strncpy(local_68,"keystr",7);
  local_68[7] = '\0';
  local_50 = 0x14;
  (*kv_ops->set_kv)(__ptr,0,local_68,&local_50);
  (*kv_ops->get_kv)(__ptr,0,local_38,&local_58);
  iVar1 = strcmp(local_38,local_68);
  if (iVar1 != 0) {
    kv_get_var_test();
  }
  if (local_58 != local_50) {
    kv_get_var_test();
  }
  (*kv_ops->get_kv)(__ptr,0,local_48,(void *)0x0);
  iVar1 = strcmp(local_48,local_68);
  if (iVar1 != 0) {
    kv_get_var_test();
  }
  free(__ptr);
  memleak_end();
  __format = "%s PASSED\n";
  if (kv_get_var_test(btree_kv_ops*)::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"kv_get_var_test");
  return;
}

Assistant:

void kv_get_var_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint64_t v_in, v_out;
    idx_t idx;
    uint8_t ksize, vsize;

    ksize = 8;
    vsize = sizeof(v_in);
    node = dummy_node(ksize, vsize, 1);

    char *str = alca(char, ksize);
    char *k1 = alca(char, ksize);
    char *k2 = alca(char, ksize);
    memset(str, 0x0, ksize);
    strcpy(str, "keystr");

    idx = 0;
    v_in = 20;

    // set get key
    kv_ops->set_kv(node, idx, str, (void *)&v_in);
    kv_ops->get_kv(node, idx, k1, (void *)&v_out);
    TEST_CHK(!(strcmp(k1, str)));
    TEST_CHK(v_out == v_in);

    // get with value is NULL
    kv_ops->get_kv(node, idx, k2, NULL);
    TEST_CHK(!(strcmp(k2, str)));

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_var_test");
}